

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O0

X509_POLICY_NODE * x509_policy_node_new(ASN1_OBJECT *policy)

{
  int iVar1;
  ASN1_OBJECT *pAVar2;
  stack_st_ASN1_OBJECT *psVar3;
  X509_POLICY_NODE *node;
  ASN1_OBJECT *policy_local;
  
  iVar1 = is_any_policy(policy);
  if (iVar1 == 0) {
    policy_local = (ASN1_OBJECT *)OPENSSL_zalloc(0x18);
    if (policy_local == (ASN1_OBJECT *)0x0) {
      policy_local = (ASN1_OBJECT *)0x0;
    }
    else {
      pAVar2 = OBJ_dup((ASN1_OBJECT *)policy);
      policy_local->sn = (char *)pAVar2;
      psVar3 = sk_ASN1_OBJECT_new_null();
      policy_local->ln = (char *)psVar3;
      if (((ASN1_OBJECT *)policy_local->sn == (ASN1_OBJECT *)0x0) ||
         ((stack_st_ASN1_OBJECT *)policy_local->ln == (stack_st_ASN1_OBJECT *)0x0)) {
        x509_policy_node_free((X509_POLICY_NODE *)policy_local);
        policy_local = (ASN1_OBJECT *)0x0;
      }
    }
    return (X509_POLICY_NODE *)policy_local;
  }
  __assert_fail("!is_any_policy(policy)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                ,0x6b,"X509_POLICY_NODE *x509_policy_node_new(const ASN1_OBJECT *)");
}

Assistant:

static X509_POLICY_NODE *x509_policy_node_new(const ASN1_OBJECT *policy) {
  assert(!is_any_policy(policy));
  X509_POLICY_NODE *node = reinterpret_cast<X509_POLICY_NODE *>(
      OPENSSL_zalloc(sizeof(X509_POLICY_NODE)));
  if (node == NULL) {
    return NULL;
  }
  node->policy = OBJ_dup(policy);
  node->parent_policies = sk_ASN1_OBJECT_new_null();
  if (node->policy == NULL || node->parent_policies == NULL) {
    x509_policy_node_free(node);
    return NULL;
  }
  return node;
}